

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O0

void Kit_TruthChangePhase_64bit(word *pInOut,int nVars,int iVar)

{
  int iVar1;
  byte bVar2;
  undefined1 local_1028 [8];
  word Temp [512];
  int SizeOfBlock;
  int Step;
  int i;
  int nWords;
  int iVar_local;
  int nVars_local;
  word *pInOut_local;
  
  iVar1 = Kit_TruthWordNum_64bit(nVars);
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckySwap.c"
                  ,0x6a,"void Kit_TruthChangePhase_64bit(word *, int, int)");
  }
  bVar2 = (byte)iVar;
  if (iVar < 6) {
    for (SizeOfBlock = 0; SizeOfBlock < iVar1; SizeOfBlock = SizeOfBlock + 1) {
      pInOut[SizeOfBlock] =
           (pInOut[SizeOfBlock] & mask0[iVar]) << ((byte)(1 << (bVar2 & 0x1f)) & 0x3f) |
           (pInOut[SizeOfBlock] & (mask0[iVar] ^ 0xffffffffffffffff)) >>
           ((byte)(1 << (bVar2 & 0x1f)) & 0x3f);
    }
  }
  else {
    Temp[0x1ff]._4_4_ = 1 << (bVar2 - 6 & 0x1f);
    Temp[0x1ff]._0_4_ = Temp[0x1ff]._4_4_ << 3;
    _iVar_local = pInOut;
    for (SizeOfBlock = 0; SizeOfBlock < iVar1; SizeOfBlock = Temp[0x1ff]._4_4_ * 2 + SizeOfBlock) {
      memcpy(local_1028,_iVar_local,(long)(int)Temp[0x1ff]);
      memcpy(_iVar_local,_iVar_local + Temp[0x1ff]._4_4_,(long)(int)Temp[0x1ff]);
      memcpy(_iVar_local + Temp[0x1ff]._4_4_,local_1028,(long)(int)Temp[0x1ff]);
      _iVar_local = _iVar_local + (Temp[0x1ff]._4_4_ << 1);
    }
  }
  return;
}

Assistant:

void Kit_TruthChangePhase_64bit( word * pInOut, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum_64bit( nVars );
    int i, Step,SizeOfBlock;
    word Temp[512];
    
    assert( iVar < nVars );
    if(iVar<=5)
    {
        for ( i = 0; i < nWords; i++ )
            pInOut[i] = ((pInOut[i] & mask0[iVar]) << (1<<(iVar))) | ((pInOut[i] & ~mask0[iVar]) >> (1<<(iVar)));
    }
    else
    {
        Step = (1 << (iVar - 6));
        SizeOfBlock = sizeof(word)*Step;
        for ( i = 0; i < nWords; i += 2*Step )
        {   
            memcpy(Temp,pInOut,SizeOfBlock);
            memcpy(pInOut,pInOut+Step,SizeOfBlock);
            memcpy(pInOut+Step,Temp,SizeOfBlock);
            //          Temp = pInOut[i];
            //          pInOut[i] = pInOut[Step+i];
            //          pInOut[Step+i] = Temp;          
            pInOut += 2*Step;
        }
    }
    
}